

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanDatatypeValidator.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::BooleanDatatypeValidator::getCanonicalRepresentation
          (BooleanDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  int iVar4;
  long lVar5;
  short *psVar6;
  void *__dest;
  undefined4 extraout_var_00;
  XMLCh *pXVar7;
  undefined7 in_register_00000009;
  undefined2 *__src;
  size_t __n;
  undefined4 extraout_var;
  
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = (this->super_DatatypeValidator).fMemoryManager;
  }
  if ((int)CONCAT71(in_register_00000009,toValidate) != 0) {
    (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xc])
              (this,rawData,0,0,memMgr);
  }
  if (rawData != L"false") {
    if (rawData == (XMLCh *)0x0) {
      psVar6 = &XMLUni::fgBooleanValueSpace;
LAB_002f2296:
      if (rawData != L"0" && *psVar6 != 0) goto LAB_002f22b2;
    }
    else {
      lVar5 = 0;
      do {
        psVar6 = (short *)((long)rawData + lVar5);
        if (*psVar6 == 0) {
          psVar6 = (short *)((long)&XMLUni::fgBooleanValueSpace + lVar5);
          goto LAB_002f2296;
        }
        psVar1 = (short *)((long)&XMLUni::fgBooleanValueSpace + lVar5);
        lVar5 = lVar5 + 2;
      } while (*psVar6 == *psVar1);
      if (rawData != L"0") {
LAB_002f22b2:
        pXVar7 = L"0";
        if (rawData == (XMLCh *)0x0) {
LAB_002f22dd:
          if (*pXVar7 == L'\0') goto LAB_002f230b;
        }
        else {
          do {
            XVar2 = *rawData;
            if (XVar2 == L'\0') goto LAB_002f22dd;
            rawData = rawData + 1;
            XVar3 = *pXVar7;
            pXVar7 = pXVar7 + 1;
          } while (XVar2 == XVar3);
        }
        __n = 0;
        do {
          psVar6 = (short *)((long)&DAT_0035d900 + __n);
          __n = __n + 2;
        } while (*psVar6 != 0);
        iVar4 = (*memMgr->_vptr_MemoryManager[3])(memMgr,__n);
        __dest = (void *)CONCAT44(extraout_var,iVar4);
        __src = &DAT_0035d900;
        goto LAB_002f2337;
      }
    }
  }
LAB_002f230b:
  __n = 0;
  do {
    psVar6 = (short *)((long)&XMLUni::fgBooleanValueSpace + __n);
    __n = __n + 2;
  } while (*psVar6 != 0);
  iVar4 = (*memMgr->_vptr_MemoryManager[3])(memMgr,__n);
  __dest = (void *)CONCAT44(extraout_var_00,iVar4);
  __src = &XMLUni::fgBooleanValueSpace;
LAB_002f2337:
  pXVar7 = (XMLCh *)memcpy(__dest,__src,__n);
  return pXVar7;
}

Assistant:

const XMLCh* BooleanDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                                ,       MemoryManager* const memMgr
                                                                ,       bool           toValidate) const
{

    MemoryManager* toUse = memMgr? memMgr : getMemoryManager();
    
    if (toValidate)
    {
        BooleanDatatypeValidator *temp = (BooleanDatatypeValidator*) this;

        try
        {
            temp->checkContent(rawData, 0, false, toUse);   
        }
        catch (...)
        {
            return 0;
        }
    }

    return ( XMLString::equals(rawData, XMLUni::fgBooleanValueSpace[0]) ||
             XMLString::equals(rawData, XMLUni::fgBooleanValueSpace[2])  ) ?
             XMLString::replicate(XMLUni::fgBooleanValueSpace[0], toUse) :
             XMLString::replicate(XMLUni::fgBooleanValueSpace[1], toUse) ;

}